

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::binary_expression,mjs::token_type_const&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
          (parser *this,token_type *args,
          unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_1,
          unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_2)

{
  binary_expression *this_00;
  expression_ptr *in_R8;
  source_extend local_50;
  undefined1 local_31;
  expression_ptr *local_30;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_local_2;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_local_1;
  token_type *args_local;
  parser *this_local;
  expression_ptr *e;
  
  args_local_2 = args_2;
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  if (*(undefined8 *)(args + 0x1a) == whitespace) {
    __assert_fail("expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x13d,
                  "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::binary_expression, Args = <const mjs::token_type &, std::unique_ptr<mjs::expression>, std::unique_ptr<mjs::expression>>]"
                 );
  }
  local_31 = 0;
  local_30 = in_R8;
  this_00 = (binary_expression *)operator_new(0x38);
  position_stack_node::extend(&local_50,*(position_stack_node **)(args + 0x1a));
  binary_expression::binary_expression
            (this_00,&local_50,
             *(token_type *)
              &(args_local_1->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,args_local_2,local_30);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)this,
             (pointer)this_00);
  source_extend::~source_extend(&local_50);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }